

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerIsInst(Lowerer *this,Instr *isInstInstr,JnHelperMethod helperMethod)

{
  LowererMD *this_00;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  uint32 inlineCacheIndex;
  IntConstOpnd *this_01;
  Opnd *pOVar4;
  Instr *pIVar5;
  RegOpnd *pRVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  Opnd *pOVar9;
  
  this_00 = &this->m_lowererMD;
  this_01 = IR::Opnd::AsIntConstOpnd(isInstInstr->m_src1);
  inlineCacheIndex = IR::IntConstOpnd::AsUint32(this_01);
  pOVar4 = LoadIsInstInlineCacheOpnd(this,isInstInstr,inlineCacheIndex);
  pIVar5 = LowererMD::LoadHelperArgument(this_00,isInstInstr,pOVar4);
  IR::Instr::FreeSrc1(isInstInstr);
  pOVar4 = IR::Instr::UnlinkSrc2(isInstInstr);
  pRVar6 = IR::Opnd::AsRegOpnd(pOVar4);
  pSVar8 = pRVar6->m_sym;
  if ((pSVar8->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19bc,"(argOpnd->m_sym->m_isSingleDef)","argOpnd->m_sym->m_isSingleDef");
    if (!bVar3) goto LAB_005524c1;
    *puVar7 = 0;
    pSVar8 = pRVar6->m_sym;
  }
  pIVar1 = (pSVar8->field_5).m_instrDef;
  IR::Opnd::Free(&pRVar6->super_Opnd,this->m_func);
  LoadScriptContext(this,isInstInstr);
  pOVar4 = IR::Instr::UnlinkSrc1(pIVar1);
  pOVar9 = IR::Instr::UnlinkSrc2(pIVar1);
  pRVar6 = IR::Opnd::AsRegOpnd(pOVar9);
  if ((pRVar6->m_sym->field_0x18 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19c6,"(argOpnd->m_sym->m_isSingleDef)","argOpnd->m_sym->m_isSingleDef");
    if (!bVar3) goto LAB_005524c1;
    *puVar7 = 0;
  }
  IR::Instr::Remove(pIVar1);
  pIVar1 = (pRVar6->m_sym->field_5).m_instrDef;
  IR::Opnd::Free(&pRVar6->super_Opnd,this->m_func);
  pOVar9 = IR::Instr::UnlinkSrc1(pIVar1);
  LowererMD::LoadHelperArgument(this_00,isInstInstr,pOVar9);
  if (pIVar1->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x19ce,"(instrArg->GetSrc2() == __null)","instrArg->GetSrc2() == NULL");
    if (!bVar3) {
LAB_005524c1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  IR::Instr::Remove(pIVar1);
  LowererMD::LoadHelperArgument(this_00,isInstInstr,pOVar4);
  LowererMD::ChangeToHelperCall
            (this_00,isInstInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerIsInst(IR::Instr * isInstInstr, IR::JnHelperMethod helperMethod)
{
    IR::Instr * instrPrev;
    IR::Instr * instrArg;
    IR::RegOpnd * argOpnd;

    // inlineCache
    instrPrev = m_lowererMD.LoadHelperArgument(isInstInstr, LoadIsInstInlineCacheOpnd(isInstInstr, isInstInstr->GetSrc1()->AsIntConstOpnd()->AsUint32()));
    isInstInstr->FreeSrc1();

    argOpnd = isInstInstr->UnlinkSrc2()->AsRegOpnd();
    Assert(argOpnd->m_sym->m_isSingleDef);
    instrArg = argOpnd->m_sym->m_instrDef;
    argOpnd->Free(m_func);

    // scriptContext
    LoadScriptContext(isInstInstr);

    // instance goes last, so remember it now
    IR::Opnd * instanceOpnd = instrArg->UnlinkSrc1();
    argOpnd = instrArg->UnlinkSrc2()->AsRegOpnd();
    Assert(argOpnd->m_sym->m_isSingleDef);
    instrArg->Remove();
    instrArg = argOpnd->m_sym->m_instrDef;
    argOpnd->Free(m_func);

    // function
    IR::Opnd *opnd = instrArg->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(isInstInstr, opnd);
    Assert(instrArg->GetSrc2() == NULL);
    instrArg->Remove();

    // instance
    m_lowererMD.LoadHelperArgument(isInstInstr, instanceOpnd);

    m_lowererMD.ChangeToHelperCall(isInstInstr, helperMethod);

    return instrPrev;
}